

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O1

int Ivy_ManHaigCountChoices(Ivy_Man_t *p,int *pnChoices)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  void *pvVar8;
  
  if (p->pHaig == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                  ,0x141,"int Ivy_ManHaigCountChoices(Ivy_Man_t *, int *)");
  }
  pVVar1 = p->pHaig->vObjs;
  lVar4 = (long)pVVar1->nSize;
  if (lVar4 < 1) {
    iVar3 = 0;
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    iVar3 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar6];
      if ((((pvVar2 != (void *)0x0) && (lVar6 != 0)) &&
          (2 < (*(uint *)((long)pvVar2 + 8) & 0xf) - 1)) && (*(int *)((long)pvVar2 + 0xc) != 0)) {
        if (((ulong)pvVar2 & 1) != 0) {
          __assert_fail("!Ivy_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                        ,0x44,"int Ivy_HaigObjCountClass(Ivy_Obj_t *)");
        }
        if (*(int *)((long)pvVar2 + 0xc) < 1) {
          __assert_fail("Ivy_ObjRefs(pObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                        ,0x45,"int Ivy_HaigObjCountClass(Ivy_Obj_t *)");
        }
        pvVar8 = *(void **)((long)pvVar2 + 0x48);
        iVar7 = 1;
        if (pvVar8 != (void *)0x0) {
          if (((ulong)pvVar8 & 1) != 0) {
            __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                          ,0x48,"int Ivy_HaigObjCountClass(Ivy_Obj_t *)");
          }
          if (pvVar8 != pvVar2) {
            iVar7 = 1;
            do {
              iVar7 = iVar7 + 1;
              pvVar8 = (void *)(*(ulong *)((long)pvVar8 + 0x48) & 0xfffffffffffffffe);
            } while (pvVar2 != pvVar8);
          }
        }
        iVar3 = iVar3 + (uint)(1 < iVar7);
        iVar5 = iVar5 + iVar7 + -1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar4);
  }
  *pnChoices = iVar5;
  return iVar3;
}

Assistant:

int Ivy_ManHaigCountChoices( Ivy_Man_t * p, int * pnChoices )
{
    Ivy_Obj_t * pObj;
    int nChoices, nChoiceNodes, Counter, i;
    assert( p->pHaig != NULL );
    nChoices = nChoiceNodes = 0;
    Ivy_ManForEachObj( p->pHaig, pObj, i )
    {
        if ( Ivy_ObjIsTerm(pObj) || i == 0 )
            continue;
        if ( Ivy_ObjRefs(pObj) == 0 )
            continue;
        Counter = Ivy_HaigObjCountClass( pObj );
        nChoiceNodes += (int)(Counter > 1);
        nChoices += Counter - 1;
//        if ( Counter > 1 )
//            printf( "Choice node %d %s\n", pObj->Id, Ivy_ObjIsLatch(pObj)? "(latch)": "" );
    }
    *pnChoices = nChoices;
    return nChoiceNodes;
}